

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O3

uint32_t helper_usub16_arm(uint32_t a,uint32_t b,void *gep)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = (a & 0xffff) - (b & 0xffff);
  uVar3 = (a >> 0x10) - (b >> 0x10);
  iVar2 = (uint)(uVar1 < 0x10000) * 3 + 0xc;
  if (0xffff < uVar3) {
    iVar2 = (uint)(uVar1 < 0x10000) * 3;
  }
  *(int *)gep = iVar2;
  return uVar1 & 0xffff | uVar3 * 0x10000;
}

Assistant:

uint32_t HELPER(glue(PFX,sub16))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    SUB16(a, b, 0);
    SUB16(a >> 16, b >> 16, 1);
    SET_GE;
    return res;
}